

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution-results.h
# Opt level: O0

Literals * __thiscall
wasm::LoggingExternalInterface::callExportAsJS
          (Literals *__return_storage_ptr__,LoggingExternalInterface *this,Index index)

{
  size_type sVar1;
  reference this_00;
  pointer pEVar2;
  Name *pNVar3;
  value_type *exp;
  Index index_local;
  LoggingExternalInterface *this_local;
  
  sVar1 = std::
          vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          ::size(&this->wasm->exports);
  if (sVar1 <= index) {
    throwJSException(this);
  }
  this_00 = std::
            vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ::operator[](&this->wasm->exports,(ulong)index);
  pEVar2 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->(this_00);
  if (pEVar2->kind != Function) {
    throwJSException(this);
  }
  pEVar2 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->(this_00);
  pNVar3 = Export::getInternalName(pEVar2);
  callFunctionAsJS(__return_storage_ptr__,this,(Name)(pNVar3->super_IString).str);
  return __return_storage_ptr__;
}

Assistant:

Literals callExportAsJS(Index index) {
    if (index >= wasm.exports.size()) {
      // No export.
      throwJSException();
    }
    auto& exp = wasm.exports[index];
    if (exp->kind != ExternalKind::Function) {
      // No callable export.
      throwJSException();
    }
    return callFunctionAsJS(*exp->getInternalName());
  }